

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fIntegerStateQueryTests.cpp
# Opt level: O0

int __thiscall
deqp::gles2::Functional::IntegerStateQueryTests::init
          (IntegerStateQueryTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  StateVerifier *pSVar2;
  QueryType QVar3;
  int iVar4;
  GetBooleanVerifier *this_00;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  TestContext *pTVar6;
  TestLog *pTVar7;
  GetIntegerVerifier *this_01;
  undefined4 extraout_var_00;
  GetFloatVerifier *this_02;
  undefined4 extraout_var_01;
  ConstantMinimumValueTestCase *this_03;
  char *pcVar8;
  long lVar9;
  SampleBuffersTestCase *this_04;
  SamplesTestCase *this_05;
  HintTestCase *this_06;
  DepthFuncTestCase *this_07;
  CullFaceTestCase *this_08;
  FrontFaceTestCase *this_09;
  ViewPortTestCase *this_10;
  ScissorBoxTestCase *this_11;
  MaxViewportDimsTestCase *this_12;
  BufferComponentSizeCase *this_13;
  StencilRefTestCase *pSVar10;
  StencilRefSeparateTestCase *pSVar11;
  StencilOpTestCase *pSVar12;
  TestNode *pTVar13;
  StencilFuncTestCase *this_14;
  StencilFuncSeparateTestCase *pSVar14;
  StencilMaskTestCase *pSVar15;
  StencilMaskSeparateTestCase *pSVar16;
  StencilWriteMaskTestCase *pSVar17;
  StencilWriteMaskSeparateTestCase *pSVar18;
  PixelStoreAlignTestCase *pPVar19;
  BlendFuncTestCase *this_15;
  void *pvVar20;
  BlendEquationTestCase *this_16;
  ImplementationArrayTestCase *pIVar21;
  BufferBindingTestCase *pBVar22;
  StencilClearValueTestCase *this_17;
  ActiveTextureTestCase *this_18;
  TextureBindingTestCase *pTVar23;
  ImplementationColorReadTestCase *this_19;
  allocator<char> local_1629;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1628;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1608;
  StateVerifier *local_15e8;
  StateVerifier *verifier_50;
  int _verifierNdx_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_15b8;
  QueryType local_1594;
  uint local_1590;
  QueryType queryType_6;
  int _queryTypeNdx_6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1568;
  QueryType local_1544;
  uint local_1540;
  QueryType queryType_5;
  int _queryTypeNdx_5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1518;
  QueryType local_14f4;
  uint local_14f0;
  QueryType queryType_4;
  int _queryTypeNdx_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_14c8;
  QueryType local_14a4;
  uint local_14a0;
  QueryType queryType_3;
  int _queryTypeNdx_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1478;
  StateVerifier *local_1458;
  StateVerifier *verifier_49;
  int _verifierNdx_49;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1428;
  StateVerifier *local_1408;
  StateVerifier *verifier_48;
  int _verifierNdx_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_13d8;
  QueryType local_13b4;
  uint local_13b0;
  QueryType queryType_2;
  int _queryTypeNdx_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1388;
  QueryType local_1364;
  uint local_1360;
  QueryType queryType_1;
  int _queryTypeNdx_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1338;
  QueryType local_1314;
  uint local_1310;
  QueryType queryType;
  int _queryTypeNdx;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_12e8;
  StateVerifier *local_12c8;
  StateVerifier *verifier_47;
  int _verifierNdx_47;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1298;
  StateVerifier *local_1278;
  StateVerifier *verifier_46;
  int _verifierNdx_46;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1228;
  StateVerifier *local_1208;
  StateVerifier *verifier_45;
  int _verifierNdx_45;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_11d8;
  StateVerifier *local_11b8;
  StateVerifier *verifier_44;
  int _verifierNdx_44;
  int testNdx_3;
  BlendEquationState blendEquationStates [2];
  allocator<char> local_1169;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1128;
  StateVerifier *local_1108;
  StateVerifier *verifier_43;
  int _verifierNdx_43;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10d8;
  StateVerifier *local_10b8;
  StateVerifier *verifier_42;
  int _verifierNdx_42;
  int testNdx_2;
  BlendColorState blendColorStates [4];
  allocator<char> local_1039;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1038;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1018;
  StateVerifier *local_ff8;
  StateVerifier *verifier_41;
  int _verifierNdx_41;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_fc8;
  StateVerifier *local_fa8;
  StateVerifier *verifier_40;
  int _verifierNdx_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f78;
  StateVerifier *local_f58;
  StateVerifier *verifier_39;
  int _verifierNdx_39;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f28;
  StateVerifier *local_f08;
  StateVerifier *verifier_38;
  int _verifierNdx_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ed8;
  StateVerifier *local_eb8;
  StateVerifier *verifier_37;
  int _verifierNdx_37;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e88;
  StateVerifier *local_e68;
  StateVerifier *verifier_36;
  int _verifierNdx_36;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e38;
  StateVerifier *local_e18;
  StateVerifier *verifier_35;
  int _verifierNdx_35;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_de8;
  StateVerifier *local_dc8;
  StateVerifier *verifier_34;
  int _verifierNdx_34;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d98;
  StateVerifier *local_d78;
  StateVerifier *verifier_33;
  int _verifierNdx_33;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d48;
  StateVerifier *local_d28;
  StateVerifier *verifier_32;
  int _verifierNdx_32;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cf8;
  StateVerifier *local_cd8;
  StateVerifier *verifier_31;
  int _verifierNdx_31;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ca8;
  StateVerifier *local_c88;
  StateVerifier *verifier_30;
  int _verifierNdx_30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c58;
  StateVerifier *local_c38;
  StateVerifier *verifier_29;
  int _verifierNdx_29;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c08;
  StateVerifier *local_be8;
  StateVerifier *verifier_28;
  int _verifierNdx_28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bb8;
  StateVerifier *local_b98;
  StateVerifier *verifier_27;
  int _verifierNdx_27;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b68;
  StateVerifier *local_b48;
  StateVerifier *verifier_26;
  int _verifierNdx_26;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b18;
  StateVerifier *local_af8;
  StateVerifier *verifier_25;
  int _verifierNdx_25;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ac8;
  StateVerifier *local_aa8;
  StateVerifier *verifier_24;
  int _verifierNdx_24;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a78;
  StateVerifier *local_a58;
  StateVerifier *verifier_23;
  int _verifierNdx_23;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9e8;
  StateVerifier *local_9c8;
  StateVerifier *verifier_22;
  int _verifierNdx_22;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_998;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_978;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_958;
  StateVerifier *local_938;
  StateVerifier *verifier_21;
  int _verifierNdx_21;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_908;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8c8;
  StateVerifier *local_8a8;
  StateVerifier *verifier_20;
  int _verifierNdx_20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_878;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_858;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_838;
  StateVerifier *local_818;
  StateVerifier *verifier_19;
  int _verifierNdx_19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7c8;
  StateVerifier *local_7a8;
  StateVerifier *verifier_18;
  int _verifierNdx_18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_778;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_758;
  StateVerifier *local_738;
  StateVerifier *verifier_17;
  int _verifierNdx_17;
  int testNdx_1;
  NamedStencilOp stencilOps [3];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_688;
  StateVerifier *local_668;
  StateVerifier *verifier_16;
  int _verifierNdx_16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_638;
  StateVerifier *local_618;
  StateVerifier *verifier_15;
  int _verifierNdx_15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e8;
  StateVerifier *local_5c8;
  StateVerifier *verifier_14;
  int _verifierNdx_14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_598;
  StateVerifier *local_578;
  StateVerifier *verifier_13;
  int _verifierNdx_13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_548;
  StateVerifier *local_528;
  StateVerifier *verifier_12;
  int _verifierNdx_12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f8;
  StateVerifier *local_4d8;
  StateVerifier *verifier_11;
  int _verifierNdx_11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  StateVerifier *local_488;
  StateVerifier *verifier_10;
  int _verifierNdx_10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  StateVerifier *local_438;
  StateVerifier *verifier_9;
  int _verifierNdx_9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  StateVerifier *local_3e8;
  StateVerifier *verifier_8;
  int _verifierNdx_8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  StateVerifier *local_398;
  StateVerifier *verifier_7;
  int _verifierNdx_7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  StateVerifier *local_348;
  StateVerifier *verifier_6;
  int _verifierNdx_6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  StateVerifier *local_2f8;
  StateVerifier *verifier_5;
  int _verifierNdx_5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  StateVerifier *local_2a8;
  StateVerifier *verifier_4;
  int _verifierNdx_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  StateVerifier *local_258;
  StateVerifier *verifier_3;
  int _verifierNdx_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  StateVerifier *local_208;
  StateVerifier *verifier_2;
  int _verifierNdx_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  StateVerifier *local_1b8;
  StateVerifier *verifier_1;
  int _verifierNdx_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  StateVerifier *local_168;
  StateVerifier *verifier;
  int _verifierNdx;
  int testNdx;
  StateVerifier *normalVerifiers [3];
  StateVerifier *implementationLimitVerifiers [2];
  LimitedStateInteger implementationMinLimits [11];
  IntegerStateQueryTests *this_local;
  
  this_00 = (GetBooleanVerifier *)operator_new(0x28);
  pRVar5 = gles2::Context::getRenderContext((this->super_TestCaseGroup).m_context);
  iVar4 = (*pRVar5->_vptr_RenderContext[3])();
  pTVar6 = gles2::Context::getTestContext((this->super_TestCaseGroup).m_context);
  pTVar7 = tcu::TestContext::getLog(pTVar6);
  IntegerStateQueryVerifiers::GetBooleanVerifier::GetBooleanVerifier
            (this_00,(Functions *)CONCAT44(extraout_var,iVar4),pTVar7);
  this->m_verifierBoolean = this_00;
  this_01 = (GetIntegerVerifier *)operator_new(0x28);
  pRVar5 = gles2::Context::getRenderContext((this->super_TestCaseGroup).m_context);
  iVar4 = (*pRVar5->_vptr_RenderContext[3])();
  pTVar6 = gles2::Context::getTestContext((this->super_TestCaseGroup).m_context);
  pTVar7 = tcu::TestContext::getLog(pTVar6);
  IntegerStateQueryVerifiers::GetIntegerVerifier::GetIntegerVerifier
            (this_01,(Functions *)CONCAT44(extraout_var_00,iVar4),pTVar7);
  this->m_verifierInteger = this_01;
  this_02 = (GetFloatVerifier *)operator_new(0x28);
  pRVar5 = gles2::Context::getRenderContext((this->super_TestCaseGroup).m_context);
  iVar4 = (*pRVar5->_vptr_RenderContext[3])();
  pTVar6 = gles2::Context::getTestContext((this->super_TestCaseGroup).m_context);
  pTVar7 = tcu::TestContext::getLog(pTVar6);
  IntegerStateQueryVerifiers::GetFloatVerifier::GetFloatVerifier
            (this_02,(Functions *)CONCAT44(extraout_var_01,iVar4),pTVar7);
  this->m_verifierFloat = this_02;
  memcpy(implementationLimitVerifiers + 1,&PTR_anon_var_dwarf_f1e50a_0328cff0,0x108);
  implementationLimitVerifiers[0] = &this->m_verifierFloat->super_StateVerifier;
  __verifierNdx = this->m_verifierBoolean;
  normalVerifiers[0] = &this->m_verifierInteger->super_StateVerifier;
  normalVerifiers[1] = &this->m_verifierFloat->super_StateVerifier;
  for (verifier._4_4_ = 0; verifier._4_4_ < 0xb; verifier._4_4_ = verifier._4_4_ + 1) {
    for (verifier._0_4_ = 0; (int)verifier < 2; verifier._0_4_ = (int)verifier + 1) {
      local_168 = implementationLimitVerifiers[(long)(int)verifier + -1];
      this_03 = (ConstantMinimumValueTestCase *)operator_new(0xa8);
      pSVar2 = local_168;
      verifier_1._6_1_ = 1;
      pCVar1 = (this->super_TestCaseGroup).m_context;
      pcVar8 = *(char **)&implementationMinLimits[(long)verifier._4_4_ + -1].targetName;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&_verifierNdx_1,pcVar8,(allocator<char> *)((long)&verifier_1 + 7));
      pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_168);
      std::operator+(&local_188,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &_verifierNdx_1,pcVar8);
      pcVar8 = (char *)std::__cxx11::string::c_str();
      lVar9 = (long)verifier._4_4_;
      anon_unknown_2::ConstantMinimumValueTestCase::ConstantMinimumValueTestCase
                (this_03,pCVar1,pSVar2,pcVar8,implementationMinLimits[lVar9].name,
                 *(GLenum *)&implementationMinLimits[lVar9].description,
                 *(GLint *)((long)&implementationMinLimits[lVar9].description + 4));
      verifier_1._6_1_ = 0;
      tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_03);
      std::__cxx11::string::~string((string *)&local_188);
      std::__cxx11::string::~string((string *)&_verifierNdx_1);
      std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_1 + 7));
    }
  }
  for (verifier_1._0_4_ = 0; (int)verifier_1 < 2; verifier_1._0_4_ = (int)verifier_1 + 1) {
    local_1b8 = implementationLimitVerifiers[(long)(int)verifier_1 + -1];
    this_04 = (SampleBuffersTestCase *)operator_new(0xa0);
    pSVar2 = local_1b8;
    verifier_2._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_2,"sample_buffers",(allocator<char> *)((long)&verifier_2 + 7)
              );
    pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_1b8);
    std::operator+(&local_1d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_2,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::SampleBuffersTestCase::SampleBuffersTestCase
              (this_04,pCVar1,pSVar2,pcVar8,"SAMPLE_BUFFERS");
    verifier_2._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_04);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string((string *)&_verifierNdx_2);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_2 + 7));
  }
  for (verifier_2._0_4_ = 0; (int)verifier_2 < 3; verifier_2._0_4_ = (int)verifier_2 + 1) {
    local_208 = *(StateVerifier **)(&_verifierNdx + (long)(int)verifier_2 * 2);
    this_05 = (SamplesTestCase *)operator_new(0xa0);
    pSVar2 = local_208;
    verifier_3._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_3,"samples",(allocator<char> *)((long)&verifier_3 + 7));
    pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_208);
    std::operator+(&local_228,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_3,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::SamplesTestCase::SamplesTestCase(this_05,pCVar1,pSVar2,pcVar8,"SAMPLES");
    verifier_3._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_05);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&_verifierNdx_3);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_3 + 7));
  }
  for (verifier_3._0_4_ = 0; (int)verifier_3 < 3; verifier_3._0_4_ = (int)verifier_3 + 1) {
    local_258 = *(StateVerifier **)(&_verifierNdx + (long)(int)verifier_3 * 2);
    this_06 = (HintTestCase *)operator_new(0xa8);
    pSVar2 = local_258;
    verifier_4._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_4,"generate_mipmap_hint",
               (allocator<char> *)((long)&verifier_4 + 7));
    pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_258);
    std::operator+(&local_278,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_4,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::HintTestCase::HintTestCase
              (this_06,pCVar1,pSVar2,pcVar8,"GENERATE_MIPMAP_HINT",0x8192);
    verifier_4._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_06);
    std::__cxx11::string::~string((string *)&local_278);
    std::__cxx11::string::~string((string *)&_verifierNdx_4);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_4 + 7));
  }
  for (verifier_4._0_4_ = 0; (int)verifier_4 < 3; verifier_4._0_4_ = (int)verifier_4 + 1) {
    local_2a8 = *(StateVerifier **)(&_verifierNdx + (long)(int)verifier_4 * 2);
    this_07 = (DepthFuncTestCase *)operator_new(0xa0);
    pSVar2 = local_2a8;
    verifier_5._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_5,"depth_func",(allocator<char> *)((long)&verifier_5 + 7));
    pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_2a8);
    std::operator+(&local_2c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_5,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::DepthFuncTestCase::DepthFuncTestCase(this_07,pCVar1,pSVar2,pcVar8,"DEPTH_FUNC");
    verifier_5._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_07);
    std::__cxx11::string::~string((string *)&local_2c8);
    std::__cxx11::string::~string((string *)&_verifierNdx_5);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_5 + 7));
  }
  for (verifier_5._0_4_ = 0; (int)verifier_5 < 3; verifier_5._0_4_ = (int)verifier_5 + 1) {
    local_2f8 = *(StateVerifier **)(&_verifierNdx + (long)(int)verifier_5 * 2);
    this_08 = (CullFaceTestCase *)operator_new(0xa0);
    pSVar2 = local_2f8;
    verifier_6._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_6,"cull_face_mode",(allocator<char> *)((long)&verifier_6 + 7)
              );
    pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_2f8);
    std::operator+(&local_318,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_6,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::CullFaceTestCase::CullFaceTestCase
              (this_08,pCVar1,pSVar2,pcVar8,"CULL_FACE_MODE");
    verifier_6._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_08);
    std::__cxx11::string::~string((string *)&local_318);
    std::__cxx11::string::~string((string *)&_verifierNdx_6);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_6 + 7));
  }
  for (verifier_6._0_4_ = 0; (int)verifier_6 < 3; verifier_6._0_4_ = (int)verifier_6 + 1) {
    local_348 = *(StateVerifier **)(&_verifierNdx + (long)(int)verifier_6 * 2);
    this_09 = (FrontFaceTestCase *)operator_new(0xa0);
    pSVar2 = local_348;
    verifier_7._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_7,"front_face_mode",
               (allocator<char> *)((long)&verifier_7 + 7));
    pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_348);
    std::operator+(&local_368,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_7,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::FrontFaceTestCase::FrontFaceTestCase(this_09,pCVar1,pSVar2,pcVar8,"FRONT_FACE");
    verifier_7._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_09);
    std::__cxx11::string::~string((string *)&local_368);
    std::__cxx11::string::~string((string *)&_verifierNdx_7);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_7 + 7));
  }
  for (verifier_7._0_4_ = 0; (int)verifier_7 < 3; verifier_7._0_4_ = (int)verifier_7 + 1) {
    local_398 = *(StateVerifier **)(&_verifierNdx + (long)(int)verifier_7 * 2);
    this_10 = (ViewPortTestCase *)operator_new(0xa0);
    pSVar2 = local_398;
    verifier_8._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_8,"viewport",(allocator<char> *)((long)&verifier_8 + 7));
    pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_398);
    std::operator+(&local_3b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_8,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::ViewPortTestCase::ViewPortTestCase(this_10,pCVar1,pSVar2,pcVar8,"VIEWPORT");
    verifier_8._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_10);
    std::__cxx11::string::~string((string *)&local_3b8);
    std::__cxx11::string::~string((string *)&_verifierNdx_8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_8 + 7));
  }
  for (verifier_8._0_4_ = 0; (int)verifier_8 < 3; verifier_8._0_4_ = (int)verifier_8 + 1) {
    local_3e8 = *(StateVerifier **)(&_verifierNdx + (long)(int)verifier_8 * 2);
    this_11 = (ScissorBoxTestCase *)operator_new(0xa0);
    pSVar2 = local_3e8;
    verifier_9._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_9,"scissor_box",(allocator<char> *)((long)&verifier_9 + 7));
    pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_3e8);
    std::operator+(&local_408,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_9,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::ScissorBoxTestCase::ScissorBoxTestCase
              (this_11,pCVar1,pSVar2,pcVar8,"SCISSOR_BOX");
    verifier_9._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_11);
    std::__cxx11::string::~string((string *)&local_408);
    std::__cxx11::string::~string((string *)&_verifierNdx_9);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_9 + 7));
  }
  for (verifier_9._0_4_ = 0; (int)verifier_9 < 3; verifier_9._0_4_ = (int)verifier_9 + 1) {
    local_438 = *(StateVerifier **)(&_verifierNdx + (long)(int)verifier_9 * 2);
    this_12 = (MaxViewportDimsTestCase *)operator_new(0xa0);
    pSVar2 = local_438;
    verifier_10._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_10,"max_viewport_dims",
               (allocator<char> *)((long)&verifier_10 + 7));
    pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_438);
    std::operator+(&local_458,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_10,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::MaxViewportDimsTestCase::MaxViewportDimsTestCase
              (this_12,pCVar1,pSVar2,pcVar8,"MAX_VIEWPORT_DIMS");
    verifier_10._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_12);
    std::__cxx11::string::~string((string *)&local_458);
    std::__cxx11::string::~string((string *)&_verifierNdx_10);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_10 + 7));
  }
  for (verifier_10._0_4_ = 0; (int)verifier_10 < 3; verifier_10._0_4_ = (int)verifier_10 + 1) {
    local_488 = *(StateVerifier **)(&_verifierNdx + (long)(int)verifier_10 * 2);
    this_13 = (BufferComponentSizeCase *)operator_new(0xa0);
    pSVar2 = local_488;
    verifier_11._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_11,"buffer_component_size",
               (allocator<char> *)((long)&verifier_11 + 7));
    pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_488);
    std::operator+(&local_4a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_11,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::BufferComponentSizeCase::BufferComponentSizeCase
              (this_13,pCVar1,pSVar2,pcVar8,"x BITS");
    verifier_11._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_13);
    std::__cxx11::string::~string((string *)&local_4a8);
    std::__cxx11::string::~string((string *)&_verifierNdx_11);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_11 + 7));
  }
  for (verifier_11._0_4_ = 0; (int)verifier_11 < 3; verifier_11._0_4_ = (int)verifier_11 + 1) {
    local_4d8 = *(StateVerifier **)(&_verifierNdx + (long)(int)verifier_11 * 2);
    pSVar10 = (StencilRefTestCase *)operator_new(0xa8);
    pSVar2 = local_4d8;
    verifier_12._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_12,"stencil_ref",(allocator<char> *)((long)&verifier_12 + 7))
    ;
    pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_4d8);
    std::operator+(&local_4f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_12,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::StencilRefTestCase::StencilRefTestCase
              (pSVar10,pCVar1,pSVar2,pcVar8,"STENCIL_REF",0xb97);
    verifier_12._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar10);
    std::__cxx11::string::~string((string *)&local_4f8);
    std::__cxx11::string::~string((string *)&_verifierNdx_12);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_12 + 7));
  }
  for (verifier_12._0_4_ = 0; (int)verifier_12 < 3; verifier_12._0_4_ = (int)verifier_12 + 1) {
    local_528 = *(StateVerifier **)(&_verifierNdx + (long)(int)verifier_12 * 2);
    pSVar10 = (StencilRefTestCase *)operator_new(0xa8);
    pSVar2 = local_528;
    verifier_13._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_13,"stencil_back_ref",
               (allocator<char> *)((long)&verifier_13 + 7));
    pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_528);
    std::operator+(&local_548,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_13,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::StencilRefTestCase::StencilRefTestCase
              (pSVar10,pCVar1,pSVar2,pcVar8,"STENCIL_BACK_REF",0x8ca3);
    verifier_13._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar10);
    std::__cxx11::string::~string((string *)&local_548);
    std::__cxx11::string::~string((string *)&_verifierNdx_13);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_13 + 7));
  }
  for (verifier_13._0_4_ = 0; (int)verifier_13 < 3; verifier_13._0_4_ = (int)verifier_13 + 1) {
    local_578 = *(StateVerifier **)(&_verifierNdx + (long)(int)verifier_13 * 2);
    pSVar11 = (StencilRefSeparateTestCase *)operator_new(0xa8);
    pSVar2 = local_578;
    verifier_14._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_14,"stencil_ref_separate",
               (allocator<char> *)((long)&verifier_14 + 7));
    pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_578);
    std::operator+(&local_598,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_14,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::StencilRefSeparateTestCase::StencilRefSeparateTestCase
              (pSVar11,pCVar1,pSVar2,pcVar8,"STENCIL_REF (separate)",0xb97,0x404);
    verifier_14._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar11);
    std::__cxx11::string::~string((string *)&local_598);
    std::__cxx11::string::~string((string *)&_verifierNdx_14);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_14 + 7));
  }
  for (verifier_14._0_4_ = 0; (int)verifier_14 < 3; verifier_14._0_4_ = (int)verifier_14 + 1) {
    local_5c8 = *(StateVerifier **)(&_verifierNdx + (long)(int)verifier_14 * 2);
    pSVar11 = (StencilRefSeparateTestCase *)operator_new(0xa8);
    pSVar2 = local_5c8;
    verifier_15._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_15,"stencil_ref_separate_both",
               (allocator<char> *)((long)&verifier_15 + 7));
    pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_5c8);
    std::operator+(&local_5e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_15,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::StencilRefSeparateTestCase::StencilRefSeparateTestCase
              (pSVar11,pCVar1,pSVar2,pcVar8,"STENCIL_REF (separate)",0xb97,0x408);
    verifier_15._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar11);
    std::__cxx11::string::~string((string *)&local_5e8);
    std::__cxx11::string::~string((string *)&_verifierNdx_15);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_15 + 7));
  }
  for (verifier_15._0_4_ = 0; (int)verifier_15 < 3; verifier_15._0_4_ = (int)verifier_15 + 1) {
    local_618 = *(StateVerifier **)(&_verifierNdx + (long)(int)verifier_15 * 2);
    pSVar11 = (StencilRefSeparateTestCase *)operator_new(0xa8);
    pSVar2 = local_618;
    verifier_16._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_16,"stencil_back_ref_separate",
               (allocator<char> *)((long)&verifier_16 + 7));
    pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_618);
    std::operator+(&local_638,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_16,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::StencilRefSeparateTestCase::StencilRefSeparateTestCase
              (pSVar11,pCVar1,pSVar2,pcVar8,"STENCIL_BACK_REF (separate)",0x8ca3,0x405);
    verifier_16._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar11);
    std::__cxx11::string::~string((string *)&local_638);
    std::__cxx11::string::~string((string *)&_verifierNdx_16);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_16 + 7));
  }
  for (verifier_16._0_4_ = 0; (int)verifier_16 < 3; verifier_16._0_4_ = (int)verifier_16 + 1) {
    local_668 = *(StateVerifier **)(&_verifierNdx + (long)(int)verifier_16 * 2);
    pSVar11 = (StencilRefSeparateTestCase *)operator_new(0xa8);
    pSVar2 = local_668;
    stencilOps[2]._38_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6a8,"stencil_back_ref_separate_both",
               (allocator<char> *)&stencilOps[2].field_0x27);
    pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_668);
    std::operator+(&local_688,&local_6a8,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::StencilRefSeparateTestCase::StencilRefSeparateTestCase
              (pSVar11,pCVar1,pSVar2,pcVar8,"STENCIL_BACK_REF (separate)",0x8ca3,0x408);
    stencilOps[2]._38_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar11);
    std::__cxx11::string::~string((string *)&local_688);
    std::__cxx11::string::~string((string *)&local_6a8);
    std::allocator<char>::~allocator((allocator<char> *)&stencilOps[2].field_0x27);
  }
  memcpy(&_verifierNdx_17,&DAT_0328d100,0x78);
  for (verifier_17._4_4_ = 0; verifier_17._4_4_ < 3; verifier_17._4_4_ = verifier_17._4_4_ + 1) {
    for (verifier_17._0_4_ = 0; (int)verifier_17 < 3; verifier_17._0_4_ = (int)verifier_17 + 1) {
      local_738 = *(StateVerifier **)(&_verifierNdx + (long)(int)verifier_17 * 2);
      pSVar12 = (StencilOpTestCase *)operator_new(0xa8);
      pSVar2 = local_738;
      verifier_18._6_1_ = 1;
      pCVar1 = (this->super_TestCaseGroup).m_context;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&_verifierNdx_18,"stencil_",(allocator<char> *)((long)&verifier_18 + 7));
      std::operator+(&local_778,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &_verifierNdx_18,*(char **)(&_verifierNdx_17 + (long)verifier_17._4_4_ * 10));
      pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_738);
      std::operator+(&local_758,&local_778,pcVar8);
      pcVar8 = (char *)std::__cxx11::string::c_str();
      anon_unknown_2::StencilOpTestCase::StencilOpTestCase
                (pSVar12,pCVar1,pSVar2,pcVar8,stencilOps[verifier_17._4_4_].name,
                 *(GLenum *)&stencilOps[verifier_17._4_4_].frontDescription);
      verifier_18._6_1_ = 0;
      tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar12);
      std::__cxx11::string::~string((string *)&local_758);
      std::__cxx11::string::~string((string *)&local_778);
      std::__cxx11::string::~string((string *)&_verifierNdx_18);
      std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_18 + 7));
    }
    for (verifier_18._0_4_ = 0; (int)verifier_18 < 3; verifier_18._0_4_ = (int)verifier_18 + 1) {
      local_7a8 = *(StateVerifier **)(&_verifierNdx + (long)(int)verifier_18 * 2);
      pSVar12 = (StencilOpTestCase *)operator_new(0xa8);
      pSVar2 = local_7a8;
      verifier_19._6_1_ = 1;
      pCVar1 = (this->super_TestCaseGroup).m_context;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&_verifierNdx_19,"stencil_back_",
                 (allocator<char> *)((long)&verifier_19 + 7));
      std::operator+(&local_7e8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &_verifierNdx_19,*(char **)(&_verifierNdx_17 + (long)verifier_17._4_4_ * 10));
      pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_7a8);
      std::operator+(&local_7c8,&local_7e8,pcVar8);
      pcVar8 = (char *)std::__cxx11::string::c_str();
      anon_unknown_2::StencilOpTestCase::StencilOpTestCase
                (pSVar12,pCVar1,pSVar2,pcVar8,*(char **)&stencilOps[verifier_17._4_4_].frontTarget,
                 *(GLenum *)&stencilOps[verifier_17._4_4_].backDescription);
      verifier_19._6_1_ = 0;
      tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar12);
      std::__cxx11::string::~string((string *)&local_7c8);
      std::__cxx11::string::~string((string *)&local_7e8);
      std::__cxx11::string::~string((string *)&_verifierNdx_19);
      std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_19 + 7));
    }
    for (verifier_19._0_4_ = 0; (int)verifier_19 < 3; verifier_19._0_4_ = (int)verifier_19 + 1) {
      local_818 = *(StateVerifier **)(&_verifierNdx + (long)(int)verifier_19 * 2);
      pTVar13 = (TestNode *)operator_new(0xa8);
      pSVar2 = local_818;
      verifier_20._6_1_ = 1;
      pCVar1 = (this->super_TestCaseGroup).m_context;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&_verifierNdx_20,"stencil_",(allocator<char> *)((long)&verifier_20 + 7));
      std::operator+(&local_878,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &_verifierNdx_20,*(char **)(&_verifierNdx_17 + (long)verifier_17._4_4_ * 10));
      std::operator+(&local_858,&local_878,"_separate_both");
      pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_818);
      std::operator+(&local_838,&local_858,pcVar8);
      pcVar8 = (char *)std::__cxx11::string::c_str();
      anon_unknown_2::StencilOpSeparateTestCase::StencilOpSeparateTestCase
                ((StencilOpSeparateTestCase *)pTVar13,pCVar1,pSVar2,pcVar8,
                 stencilOps[verifier_17._4_4_].name,
                 *(GLenum *)&stencilOps[verifier_17._4_4_].frontDescription,0x408);
      verifier_20._6_1_ = 0;
      tcu::TestNode::addChild((TestNode *)this,pTVar13);
      std::__cxx11::string::~string((string *)&local_838);
      std::__cxx11::string::~string((string *)&local_858);
      std::__cxx11::string::~string((string *)&local_878);
      std::__cxx11::string::~string((string *)&_verifierNdx_20);
      std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_20 + 7));
    }
    for (verifier_20._0_4_ = 0; (int)verifier_20 < 3; verifier_20._0_4_ = (int)verifier_20 + 1) {
      local_8a8 = *(StateVerifier **)(&_verifierNdx + (long)(int)verifier_20 * 2);
      pTVar13 = (TestNode *)operator_new(0xa8);
      pSVar2 = local_8a8;
      verifier_21._6_1_ = 1;
      pCVar1 = (this->super_TestCaseGroup).m_context;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&_verifierNdx_21,"stencil_back_",
                 (allocator<char> *)((long)&verifier_21 + 7));
      std::operator+(&local_908,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &_verifierNdx_21,*(char **)(&_verifierNdx_17 + (long)verifier_17._4_4_ * 10));
      std::operator+(&local_8e8,&local_908,"_separate_both");
      pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_8a8);
      std::operator+(&local_8c8,&local_8e8,pcVar8);
      pcVar8 = (char *)std::__cxx11::string::c_str();
      anon_unknown_2::StencilOpSeparateTestCase::StencilOpSeparateTestCase
                ((StencilOpSeparateTestCase *)pTVar13,pCVar1,pSVar2,pcVar8,
                 *(char **)&stencilOps[verifier_17._4_4_].frontTarget,
                 *(GLenum *)&stencilOps[verifier_17._4_4_].backDescription,0x408);
      verifier_21._6_1_ = 0;
      tcu::TestNode::addChild((TestNode *)this,pTVar13);
      std::__cxx11::string::~string((string *)&local_8c8);
      std::__cxx11::string::~string((string *)&local_8e8);
      std::__cxx11::string::~string((string *)&local_908);
      std::__cxx11::string::~string((string *)&_verifierNdx_21);
      std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_21 + 7));
    }
    for (verifier_21._0_4_ = 0; (int)verifier_21 < 3; verifier_21._0_4_ = (int)verifier_21 + 1) {
      local_938 = *(StateVerifier **)(&_verifierNdx + (long)(int)verifier_21 * 2);
      pTVar13 = (TestNode *)operator_new(0xa8);
      pSVar2 = local_938;
      verifier_22._6_1_ = 1;
      pCVar1 = (this->super_TestCaseGroup).m_context;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&_verifierNdx_22,"stencil_",(allocator<char> *)((long)&verifier_22 + 7));
      std::operator+(&local_998,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &_verifierNdx_22,*(char **)(&_verifierNdx_17 + (long)verifier_17._4_4_ * 10));
      std::operator+(&local_978,&local_998,"_separate");
      pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_938);
      std::operator+(&local_958,&local_978,pcVar8);
      pcVar8 = (char *)std::__cxx11::string::c_str();
      anon_unknown_2::StencilOpSeparateTestCase::StencilOpSeparateTestCase
                ((StencilOpSeparateTestCase *)pTVar13,pCVar1,pSVar2,pcVar8,
                 stencilOps[verifier_17._4_4_].name,
                 *(GLenum *)&stencilOps[verifier_17._4_4_].frontDescription,0x404);
      verifier_22._6_1_ = 0;
      tcu::TestNode::addChild((TestNode *)this,pTVar13);
      std::__cxx11::string::~string((string *)&local_958);
      std::__cxx11::string::~string((string *)&local_978);
      std::__cxx11::string::~string((string *)&local_998);
      std::__cxx11::string::~string((string *)&_verifierNdx_22);
      std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_22 + 7));
    }
    for (verifier_22._0_4_ = 0; (int)verifier_22 < 3; verifier_22._0_4_ = (int)verifier_22 + 1) {
      local_9c8 = *(StateVerifier **)(&_verifierNdx + (long)(int)verifier_22 * 2);
      pTVar13 = (TestNode *)operator_new(0xa8);
      pSVar2 = local_9c8;
      verifier_23._6_1_ = 1;
      pCVar1 = (this->super_TestCaseGroup).m_context;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&_verifierNdx_23,"stencil_back_",
                 (allocator<char> *)((long)&verifier_23 + 7));
      std::operator+(&local_a28,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &_verifierNdx_23,*(char **)(&_verifierNdx_17 + (long)verifier_17._4_4_ * 10));
      std::operator+(&local_a08,&local_a28,"_separate");
      pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_9c8);
      std::operator+(&local_9e8,&local_a08,pcVar8);
      pcVar8 = (char *)std::__cxx11::string::c_str();
      anon_unknown_2::StencilOpSeparateTestCase::StencilOpSeparateTestCase
                ((StencilOpSeparateTestCase *)pTVar13,pCVar1,pSVar2,pcVar8,
                 *(char **)&stencilOps[verifier_17._4_4_].frontTarget,
                 *(GLenum *)&stencilOps[verifier_17._4_4_].backDescription,0x405);
      verifier_23._6_1_ = 0;
      tcu::TestNode::addChild((TestNode *)this,pTVar13);
      std::__cxx11::string::~string((string *)&local_9e8);
      std::__cxx11::string::~string((string *)&local_a08);
      std::__cxx11::string::~string((string *)&local_a28);
      std::__cxx11::string::~string((string *)&_verifierNdx_23);
      std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_23 + 7));
    }
  }
  for (verifier_23._0_4_ = 0; (int)verifier_23 < 3; verifier_23._0_4_ = (int)verifier_23 + 1) {
    local_a58 = *(StateVerifier **)(&_verifierNdx + (long)(int)verifier_23 * 2);
    this_14 = (StencilFuncTestCase *)operator_new(0xa0);
    pSVar2 = local_a58;
    verifier_24._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_24,"stencil_func",(allocator<char> *)((long)&verifier_24 + 7)
              );
    pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_a58);
    std::operator+(&local_a78,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_24,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::StencilFuncTestCase::StencilFuncTestCase
              (this_14,pCVar1,pSVar2,pcVar8,"STENCIL_FUNC");
    verifier_24._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_14);
    std::__cxx11::string::~string((string *)&local_a78);
    std::__cxx11::string::~string((string *)&_verifierNdx_24);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_24 + 7));
  }
  for (verifier_24._0_4_ = 0; (int)verifier_24 < 3; verifier_24._0_4_ = (int)verifier_24 + 1) {
    local_aa8 = *(StateVerifier **)(&_verifierNdx + (long)(int)verifier_24 * 2);
    pSVar14 = (StencilFuncSeparateTestCase *)operator_new(0xa8);
    pSVar2 = local_aa8;
    verifier_25._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_25,"stencil_func_separate",
               (allocator<char> *)((long)&verifier_25 + 7));
    pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_aa8);
    std::operator+(&local_ac8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_25,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::StencilFuncSeparateTestCase::StencilFuncSeparateTestCase
              (pSVar14,pCVar1,pSVar2,pcVar8,"STENCIL_FUNC (separate)",0xb92,0x404);
    verifier_25._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar14);
    std::__cxx11::string::~string((string *)&local_ac8);
    std::__cxx11::string::~string((string *)&_verifierNdx_25);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_25 + 7));
  }
  for (verifier_25._0_4_ = 0; (int)verifier_25 < 3; verifier_25._0_4_ = (int)verifier_25 + 1) {
    local_af8 = *(StateVerifier **)(&_verifierNdx + (long)(int)verifier_25 * 2);
    pSVar14 = (StencilFuncSeparateTestCase *)operator_new(0xa8);
    pSVar2 = local_af8;
    verifier_26._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_26,"stencil_func_separate_both",
               (allocator<char> *)((long)&verifier_26 + 7));
    pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_af8);
    std::operator+(&local_b18,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_26,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::StencilFuncSeparateTestCase::StencilFuncSeparateTestCase
              (pSVar14,pCVar1,pSVar2,pcVar8,"STENCIL_FUNC (separate)",0xb92,0x408);
    verifier_26._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar14);
    std::__cxx11::string::~string((string *)&local_b18);
    std::__cxx11::string::~string((string *)&_verifierNdx_26);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_26 + 7));
  }
  for (verifier_26._0_4_ = 0; (int)verifier_26 < 3; verifier_26._0_4_ = (int)verifier_26 + 1) {
    local_b48 = *(StateVerifier **)(&_verifierNdx + (long)(int)verifier_26 * 2);
    pSVar14 = (StencilFuncSeparateTestCase *)operator_new(0xa8);
    pSVar2 = local_b48;
    verifier_27._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_27,"stencil_back_func_separate",
               (allocator<char> *)((long)&verifier_27 + 7));
    pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_b48);
    std::operator+(&local_b68,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_27,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::StencilFuncSeparateTestCase::StencilFuncSeparateTestCase
              (pSVar14,pCVar1,pSVar2,pcVar8,"STENCIL_FUNC (separate)",0x8800,0x405);
    verifier_27._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar14);
    std::__cxx11::string::~string((string *)&local_b68);
    std::__cxx11::string::~string((string *)&_verifierNdx_27);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_27 + 7));
  }
  for (verifier_27._0_4_ = 0; (int)verifier_27 < 3; verifier_27._0_4_ = (int)verifier_27 + 1) {
    local_b98 = *(StateVerifier **)(&_verifierNdx + (long)(int)verifier_27 * 2);
    pSVar14 = (StencilFuncSeparateTestCase *)operator_new(0xa8);
    pSVar2 = local_b98;
    verifier_28._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_28,"stencil_back_func_separate_both",
               (allocator<char> *)((long)&verifier_28 + 7));
    pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_b98);
    std::operator+(&local_bb8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_28,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::StencilFuncSeparateTestCase::StencilFuncSeparateTestCase
              (pSVar14,pCVar1,pSVar2,pcVar8,"STENCIL_FUNC (separate)",0x8800,0x408);
    verifier_28._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar14);
    std::__cxx11::string::~string((string *)&local_bb8);
    std::__cxx11::string::~string((string *)&_verifierNdx_28);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_28 + 7));
  }
  for (verifier_28._0_4_ = 0; (int)verifier_28 < 3; verifier_28._0_4_ = (int)verifier_28 + 1) {
    local_be8 = *(StateVerifier **)(&_verifierNdx + (long)(int)verifier_28 * 2);
    pSVar15 = (StencilMaskTestCase *)operator_new(0xa8);
    pSVar2 = local_be8;
    verifier_29._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_29,"stencil_value_mask",
               (allocator<char> *)((long)&verifier_29 + 7));
    pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_be8);
    std::operator+(&local_c08,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_29,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::StencilMaskTestCase::StencilMaskTestCase
              (pSVar15,pCVar1,pSVar2,pcVar8,"STENCIL_VALUE_MASK",0xb93);
    verifier_29._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar15);
    std::__cxx11::string::~string((string *)&local_c08);
    std::__cxx11::string::~string((string *)&_verifierNdx_29);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_29 + 7));
  }
  for (verifier_29._0_4_ = 0; (int)verifier_29 < 3; verifier_29._0_4_ = (int)verifier_29 + 1) {
    local_c38 = *(StateVerifier **)(&_verifierNdx + (long)(int)verifier_29 * 2);
    pSVar15 = (StencilMaskTestCase *)operator_new(0xa8);
    pSVar2 = local_c38;
    verifier_30._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_30,"stencil_back_value_mask",
               (allocator<char> *)((long)&verifier_30 + 7));
    pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_c38);
    std::operator+(&local_c58,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_30,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::StencilMaskTestCase::StencilMaskTestCase
              (pSVar15,pCVar1,pSVar2,pcVar8,"STENCIL_BACK_VALUE_MASK",0x8ca4);
    verifier_30._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar15);
    std::__cxx11::string::~string((string *)&local_c58);
    std::__cxx11::string::~string((string *)&_verifierNdx_30);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_30 + 7));
  }
  for (verifier_30._0_4_ = 0; (int)verifier_30 < 3; verifier_30._0_4_ = (int)verifier_30 + 1) {
    local_c88 = *(StateVerifier **)(&_verifierNdx + (long)(int)verifier_30 * 2);
    pSVar16 = (StencilMaskSeparateTestCase *)operator_new(0xa8);
    pSVar2 = local_c88;
    verifier_31._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_31,"stencil_value_mask_separate",
               (allocator<char> *)((long)&verifier_31 + 7));
    pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_c88);
    std::operator+(&local_ca8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_31,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::StencilMaskSeparateTestCase::StencilMaskSeparateTestCase
              (pSVar16,pCVar1,pSVar2,pcVar8,"STENCIL_VALUE_MASK (separate)",0xb93,0x404);
    verifier_31._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar16);
    std::__cxx11::string::~string((string *)&local_ca8);
    std::__cxx11::string::~string((string *)&_verifierNdx_31);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_31 + 7));
  }
  for (verifier_31._0_4_ = 0; (int)verifier_31 < 3; verifier_31._0_4_ = (int)verifier_31 + 1) {
    local_cd8 = *(StateVerifier **)(&_verifierNdx + (long)(int)verifier_31 * 2);
    pSVar16 = (StencilMaskSeparateTestCase *)operator_new(0xa8);
    pSVar2 = local_cd8;
    verifier_32._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_32,"stencil_value_mask_separate_both",
               (allocator<char> *)((long)&verifier_32 + 7));
    pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_cd8);
    std::operator+(&local_cf8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_32,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::StencilMaskSeparateTestCase::StencilMaskSeparateTestCase
              (pSVar16,pCVar1,pSVar2,pcVar8,"STENCIL_VALUE_MASK (separate)",0xb93,0x408);
    verifier_32._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar16);
    std::__cxx11::string::~string((string *)&local_cf8);
    std::__cxx11::string::~string((string *)&_verifierNdx_32);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_32 + 7));
  }
  for (verifier_32._0_4_ = 0; (int)verifier_32 < 3; verifier_32._0_4_ = (int)verifier_32 + 1) {
    local_d28 = *(StateVerifier **)(&_verifierNdx + (long)(int)verifier_32 * 2);
    pSVar16 = (StencilMaskSeparateTestCase *)operator_new(0xa8);
    pSVar2 = local_d28;
    verifier_33._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_33,"stencil_back_value_mask_separate",
               (allocator<char> *)((long)&verifier_33 + 7));
    pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_d28);
    std::operator+(&local_d48,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_33,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::StencilMaskSeparateTestCase::StencilMaskSeparateTestCase
              (pSVar16,pCVar1,pSVar2,pcVar8,"STENCIL_BACK_VALUE_MASK (separate)",0x8ca4,0x405);
    verifier_33._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar16);
    std::__cxx11::string::~string((string *)&local_d48);
    std::__cxx11::string::~string((string *)&_verifierNdx_33);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_33 + 7));
  }
  for (verifier_33._0_4_ = 0; (int)verifier_33 < 3; verifier_33._0_4_ = (int)verifier_33 + 1) {
    local_d78 = *(StateVerifier **)(&_verifierNdx + (long)(int)verifier_33 * 2);
    pSVar16 = (StencilMaskSeparateTestCase *)operator_new(0xa8);
    pSVar2 = local_d78;
    verifier_34._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_34,"stencil_back_value_mask_separate_both",
               (allocator<char> *)((long)&verifier_34 + 7));
    pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_d78);
    std::operator+(&local_d98,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_34,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::StencilMaskSeparateTestCase::StencilMaskSeparateTestCase
              (pSVar16,pCVar1,pSVar2,pcVar8,"STENCIL_BACK_VALUE_MASK (separate)",0x8ca4,0x408);
    verifier_34._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar16);
    std::__cxx11::string::~string((string *)&local_d98);
    std::__cxx11::string::~string((string *)&_verifierNdx_34);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_34 + 7));
  }
  for (verifier_34._0_4_ = 0; (int)verifier_34 < 3; verifier_34._0_4_ = (int)verifier_34 + 1) {
    local_dc8 = *(StateVerifier **)(&_verifierNdx + (long)(int)verifier_34 * 2);
    pSVar17 = (StencilWriteMaskTestCase *)operator_new(0xa8);
    pSVar2 = local_dc8;
    verifier_35._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_35,"stencil_writemask",
               (allocator<char> *)((long)&verifier_35 + 7));
    pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_dc8);
    std::operator+(&local_de8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_35,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::StencilWriteMaskTestCase::StencilWriteMaskTestCase
              (pSVar17,pCVar1,pSVar2,pcVar8,"STENCIL_WRITEMASK",0xb98);
    verifier_35._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar17);
    std::__cxx11::string::~string((string *)&local_de8);
    std::__cxx11::string::~string((string *)&_verifierNdx_35);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_35 + 7));
  }
  for (verifier_35._0_4_ = 0; (int)verifier_35 < 3; verifier_35._0_4_ = (int)verifier_35 + 1) {
    local_e18 = *(StateVerifier **)(&_verifierNdx + (long)(int)verifier_35 * 2);
    pSVar17 = (StencilWriteMaskTestCase *)operator_new(0xa8);
    pSVar2 = local_e18;
    verifier_36._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_36,"stencil_back_writemask",
               (allocator<char> *)((long)&verifier_36 + 7));
    pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_e18);
    std::operator+(&local_e38,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_36,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::StencilWriteMaskTestCase::StencilWriteMaskTestCase
              (pSVar17,pCVar1,pSVar2,pcVar8,"STENCIL_BACK_WRITEMASK",0x8ca5);
    verifier_36._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar17);
    std::__cxx11::string::~string((string *)&local_e38);
    std::__cxx11::string::~string((string *)&_verifierNdx_36);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_36 + 7));
  }
  for (verifier_36._0_4_ = 0; (int)verifier_36 < 3; verifier_36._0_4_ = (int)verifier_36 + 1) {
    local_e68 = *(StateVerifier **)(&_verifierNdx + (long)(int)verifier_36 * 2);
    pSVar18 = (StencilWriteMaskSeparateTestCase *)operator_new(0xa8);
    pSVar2 = local_e68;
    verifier_37._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_37,"stencil_writemask_separate",
               (allocator<char> *)((long)&verifier_37 + 7));
    pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_e68);
    std::operator+(&local_e88,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_37,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::StencilWriteMaskSeparateTestCase::StencilWriteMaskSeparateTestCase
              (pSVar18,pCVar1,pSVar2,pcVar8,"STENCIL_WRITEMASK (separate)",0xb98,0x404);
    verifier_37._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar18);
    std::__cxx11::string::~string((string *)&local_e88);
    std::__cxx11::string::~string((string *)&_verifierNdx_37);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_37 + 7));
  }
  for (verifier_37._0_4_ = 0; (int)verifier_37 < 3; verifier_37._0_4_ = (int)verifier_37 + 1) {
    local_eb8 = *(StateVerifier **)(&_verifierNdx + (long)(int)verifier_37 * 2);
    pSVar18 = (StencilWriteMaskSeparateTestCase *)operator_new(0xa8);
    pSVar2 = local_eb8;
    verifier_38._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_38,"stencil_writemask_separate_both",
               (allocator<char> *)((long)&verifier_38 + 7));
    pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_eb8);
    std::operator+(&local_ed8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_38,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::StencilWriteMaskSeparateTestCase::StencilWriteMaskSeparateTestCase
              (pSVar18,pCVar1,pSVar2,pcVar8,"STENCIL_WRITEMASK (separate)",0xb98,0x408);
    verifier_38._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar18);
    std::__cxx11::string::~string((string *)&local_ed8);
    std::__cxx11::string::~string((string *)&_verifierNdx_38);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_38 + 7));
  }
  for (verifier_38._0_4_ = 0; (int)verifier_38 < 3; verifier_38._0_4_ = (int)verifier_38 + 1) {
    local_f08 = *(StateVerifier **)(&_verifierNdx + (long)(int)verifier_38 * 2);
    pSVar18 = (StencilWriteMaskSeparateTestCase *)operator_new(0xa8);
    pSVar2 = local_f08;
    verifier_39._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_39,"stencil_back_writemask_separate",
               (allocator<char> *)((long)&verifier_39 + 7));
    pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_f08);
    std::operator+(&local_f28,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_39,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::StencilWriteMaskSeparateTestCase::StencilWriteMaskSeparateTestCase
              (pSVar18,pCVar1,pSVar2,pcVar8,"STENCIL_BACK_WRITEMASK (separate)",0x8ca5,0x405);
    verifier_39._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar18);
    std::__cxx11::string::~string((string *)&local_f28);
    std::__cxx11::string::~string((string *)&_verifierNdx_39);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_39 + 7));
  }
  for (verifier_39._0_4_ = 0; (int)verifier_39 < 3; verifier_39._0_4_ = (int)verifier_39 + 1) {
    local_f58 = *(StateVerifier **)(&_verifierNdx + (long)(int)verifier_39 * 2);
    pSVar18 = (StencilWriteMaskSeparateTestCase *)operator_new(0xa8);
    pSVar2 = local_f58;
    verifier_40._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_40,"stencil_back_writemask_separate_both",
               (allocator<char> *)((long)&verifier_40 + 7));
    pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_f58);
    std::operator+(&local_f78,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_40,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::StencilWriteMaskSeparateTestCase::StencilWriteMaskSeparateTestCase
              (pSVar18,pCVar1,pSVar2,pcVar8,"STENCIL_BACK_WRITEMASK (separate)",0x8ca5,0x408);
    verifier_40._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar18);
    std::__cxx11::string::~string((string *)&local_f78);
    std::__cxx11::string::~string((string *)&_verifierNdx_40);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_40 + 7));
  }
  for (verifier_40._0_4_ = 0; (int)verifier_40 < 3; verifier_40._0_4_ = (int)verifier_40 + 1) {
    local_fa8 = *(StateVerifier **)(&_verifierNdx + (long)(int)verifier_40 * 2);
    pPVar19 = (PixelStoreAlignTestCase *)operator_new(0xa8);
    pSVar2 = local_fa8;
    verifier_41._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_41,"unpack_alignment",
               (allocator<char> *)((long)&verifier_41 + 7));
    pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_fa8);
    std::operator+(&local_fc8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_41,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::PixelStoreAlignTestCase::PixelStoreAlignTestCase
              (pPVar19,pCVar1,pSVar2,pcVar8,"UNPACK_ALIGNMENT",0xcf5);
    verifier_41._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pPVar19);
    std::__cxx11::string::~string((string *)&local_fc8);
    std::__cxx11::string::~string((string *)&_verifierNdx_41);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_41 + 7));
  }
  for (verifier_41._0_4_ = 0; (int)verifier_41 < 3; verifier_41._0_4_ = (int)verifier_41 + 1) {
    local_ff8 = *(StateVerifier **)(&_verifierNdx + (long)(int)verifier_41 * 2);
    pPVar19 = (PixelStoreAlignTestCase *)operator_new(0xa8);
    pSVar2 = local_ff8;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1038,"pack_alignment",&local_1039);
    pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_ff8);
    std::operator+(&local_1018,&local_1038,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::PixelStoreAlignTestCase::PixelStoreAlignTestCase
              (pPVar19,pCVar1,pSVar2,pcVar8,"PACK_ALIGNMENT",0xd05);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pPVar19);
    std::__cxx11::string::~string((string *)&local_1018);
    std::__cxx11::string::~string((string *)&local_1038);
    std::allocator<char>::~allocator(&local_1039);
  }
  memcpy(&_verifierNdx_42,&PTR_anon_var_dwarf_f50e2f_0328d180,0x60);
  for (verifier_42._4_4_ = 0; verifier_42._4_4_ < 4; verifier_42._4_4_ = verifier_42._4_4_ + 1) {
    for (verifier_42._0_4_ = 0; (int)verifier_42 < 3; verifier_42._0_4_ = (int)verifier_42 + 1) {
      local_10b8 = *(StateVerifier **)(&_verifierNdx + (long)(int)verifier_42 * 2);
      this_15 = (BlendFuncTestCase *)operator_new(0xa8);
      pSVar2 = local_10b8;
      verifier_43._6_1_ = 1;
      pCVar1 = (this->super_TestCaseGroup).m_context;
      pcVar8 = *(char **)(&_verifierNdx_42 + (long)verifier_42._4_4_ * 6);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&_verifierNdx_43,pcVar8,(allocator<char> *)((long)&verifier_43 + 7));
      pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_10b8);
      std::operator+(&local_10d8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &_verifierNdx_43,pcVar8);
      pcVar8 = (char *)std::__cxx11::string::c_str();
      lVar9 = (long)verifier_42._4_4_;
      anon_unknown_2::BlendFuncTestCase::BlendFuncTestCase
                (this_15,pCVar1,pSVar2,pcVar8,blendColorStates[lVar9].name,
                 *(GLenum *)&blendColorStates[lVar9].description,
                 *(int *)((long)&blendColorStates[lVar9].description + 4));
      verifier_43._6_1_ = 0;
      tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_15);
      std::__cxx11::string::~string((string *)&local_10d8);
      std::__cxx11::string::~string((string *)&_verifierNdx_43);
      std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_43 + 7));
    }
    for (verifier_43._0_4_ = 0; (int)verifier_43 < 3; verifier_43._0_4_ = (int)verifier_43 + 1) {
      local_1108 = *(StateVerifier **)(&_verifierNdx + (long)(int)verifier_43 * 2);
      pTVar13 = (TestNode *)operator_new(0xa8);
      pSVar2 = local_1108;
      pCVar1 = (this->super_TestCaseGroup).m_context;
      pcVar8 = *(char **)(&_verifierNdx_42 + (long)verifier_42._4_4_ * 6);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1168,pcVar8,&local_1169);
      std::operator+(&local_1148,&local_1168,"_separate");
      pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_1108);
      std::operator+(&local_1128,&local_1148,pcVar8);
      pcVar8 = (char *)std::__cxx11::string::c_str();
      lVar9 = (long)verifier_42._4_4_;
      anon_unknown_2::BlendFuncSeparateTestCase::BlendFuncSeparateTestCase
                ((BlendFuncSeparateTestCase *)pTVar13,pCVar1,pSVar2,pcVar8,
                 blendColorStates[lVar9].name,*(GLenum *)&blendColorStates[lVar9].description,
                 *(int *)((long)&blendColorStates[lVar9].description + 4));
      tcu::TestNode::addChild((TestNode *)this,pTVar13);
      std::__cxx11::string::~string((string *)&local_1128);
      std::__cxx11::string::~string((string *)&local_1148);
      std::__cxx11::string::~string((string *)&local_1168);
      std::allocator<char>::~allocator(&local_1169);
    }
  }
  pvVar20 = memcpy(&_verifierNdx_44,&PTR_anon_var_dwarf_f50e88_0328d1e0,0x30);
  verifier_44._4_4_ = 0;
  while ((int)verifier_44._4_4_ < 2) {
    for (verifier_44._0_4_ = 0; (int)verifier_44 < 3; verifier_44._0_4_ = (int)verifier_44 + 1) {
      local_11b8 = *(StateVerifier **)(&_verifierNdx + (long)(int)verifier_44 * 2);
      this_16 = (BlendEquationTestCase *)operator_new(0xa8);
      pSVar2 = local_11b8;
      verifier_45._6_1_ = 1;
      pCVar1 = (this->super_TestCaseGroup).m_context;
      pcVar8 = *(char **)(&_verifierNdx_44 + (long)(int)verifier_44._4_4_ * 6);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&_verifierNdx_45,pcVar8,(allocator<char> *)((long)&verifier_45 + 7));
      pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_11b8);
      std::operator+(&local_11d8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &_verifierNdx_45,pcVar8);
      pcVar8 = (char *)std::__cxx11::string::c_str();
      lVar9 = (long)(int)verifier_44._4_4_;
      anon_unknown_2::BlendEquationTestCase::BlendEquationTestCase
                (this_16,pCVar1,pSVar2,pcVar8,blendEquationStates[lVar9].name,
                 *(GLenum *)&blendEquationStates[lVar9].description,
                 *(int *)((long)&blendEquationStates[lVar9].description + 4));
      verifier_45._6_1_ = 0;
      tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_16);
      std::__cxx11::string::~string((string *)&local_11d8);
      std::__cxx11::string::~string((string *)&_verifierNdx_45);
      std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_45 + 7));
    }
    for (verifier_45._0_4_ = 0; (int)verifier_45 < 3; verifier_45._0_4_ = (int)verifier_45 + 1) {
      local_1208 = *(StateVerifier **)(&_verifierNdx + (long)(int)verifier_45 * 2);
      pTVar13 = (TestNode *)operator_new(0xa8);
      pSVar2 = local_1208;
      verifier_46._6_1_ = 1;
      pCVar1 = (this->super_TestCaseGroup).m_context;
      pcVar8 = *(char **)(&_verifierNdx_44 + (long)(int)verifier_44._4_4_ * 6);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&_verifierNdx_46,pcVar8,(allocator<char> *)((long)&verifier_46 + 7));
      std::operator+(&local_1248,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &_verifierNdx_46,"_separate");
      pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_1208);
      std::operator+(&local_1228,&local_1248,pcVar8);
      pcVar8 = (char *)std::__cxx11::string::c_str();
      lVar9 = (long)(int)verifier_44._4_4_;
      anon_unknown_2::BlendEquationSeparateTestCase::BlendEquationSeparateTestCase
                ((BlendEquationSeparateTestCase *)pTVar13,pCVar1,pSVar2,pcVar8,
                 blendEquationStates[lVar9].name,*(GLenum *)&blendEquationStates[lVar9].description,
                 *(int *)((long)&blendEquationStates[lVar9].description + 4));
      verifier_46._6_1_ = 0;
      tcu::TestNode::addChild((TestNode *)this,pTVar13);
      std::__cxx11::string::~string((string *)&local_1228);
      std::__cxx11::string::~string((string *)&local_1248);
      std::__cxx11::string::~string((string *)&_verifierNdx_46);
      std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_46 + 7));
    }
    verifier_44._4_4_ = verifier_44._4_4_ + 1;
    pvVar20 = (void *)(ulong)verifier_44._4_4_;
  }
  verifier_46._0_4_ = 0;
  while ((int)(uint)verifier_46 < 3) {
    local_1278 = *(StateVerifier **)(&_verifierNdx + (long)(int)(uint)verifier_46 * 2);
    pIVar21 = (ImplementationArrayTestCase *)operator_new(0xb0);
    pSVar2 = local_1278;
    verifier_47._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_47,"compressed_texture_formats",
               (allocator<char> *)((long)&verifier_47 + 7));
    pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_1278);
    std::operator+(&local_1298,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_47,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::ImplementationArrayTestCase::ImplementationArrayTestCase
              (pIVar21,pCVar1,pSVar2,pcVar8,"COMPRESSED_TEXTURE_FORMATS",0x86a3,0x86a2,0);
    verifier_47._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pIVar21);
    std::__cxx11::string::~string((string *)&local_1298);
    std::__cxx11::string::~string((string *)&_verifierNdx_47);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_47 + 7));
    verifier_46._0_4_ = (uint)verifier_46 + 1;
    pvVar20 = (void *)(ulong)(uint)verifier_46;
  }
  verifier_47._0_4_ = 0;
  while ((int)(uint)verifier_47 < 3) {
    local_12c8 = *(StateVerifier **)(&_verifierNdx + (long)(int)(uint)verifier_47 * 2);
    pIVar21 = (ImplementationArrayTestCase *)operator_new(0xb0);
    pSVar2 = local_12c8;
    queryType._2_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_queryTypeNdx,"shader_binary_formats",
               (allocator<char> *)((long)&queryType + 3));
    pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_12c8);
    std::operator+(&local_12e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_queryTypeNdx,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::ImplementationArrayTestCase::ImplementationArrayTestCase
              (pIVar21,pCVar1,pSVar2,pcVar8,"SHADER_BINARY_FORMATS",0x8df8,0x8df9,0);
    queryType._2_1_ = QUERY_BOOLEAN >> 0x10;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pIVar21);
    std::__cxx11::string::~string((string *)&local_12e8);
    std::__cxx11::string::~string((string *)&_queryTypeNdx);
    std::allocator<char>::~allocator((allocator<char> *)((long)&queryType + 3));
    verifier_47._0_4_ = (uint)verifier_47 + 1;
    pvVar20 = (void *)(ulong)(uint)verifier_47;
  }
  local_1310 = 0;
  while ((int)local_1310 < 3) {
    local_1314 = init::queryTypes[(int)local_1310];
    pBVar22 = (BufferBindingTestCase *)operator_new(0x88);
    QVar3 = local_1314;
    queryType_1._2_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_queryTypeNdx_1,"array_buffer_binding",
               (allocator<char> *)((long)&queryType_1 + 3));
    pcVar8 = anon_unknown_2::getQueryTypeSuffix(local_1314);
    std::operator+(&local_1338,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_queryTypeNdx_1,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::BufferBindingTestCase::BufferBindingTestCase
              (pBVar22,pCVar1,QVar3,pcVar8,"ARRAY_BUFFER_BINDING",0x8894,0x8892);
    queryType_1._2_1_ = QUERY_BOOLEAN >> 0x10;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pBVar22);
    std::__cxx11::string::~string((string *)&local_1338);
    std::__cxx11::string::~string((string *)&_queryTypeNdx_1);
    std::allocator<char>::~allocator((allocator<char> *)((long)&queryType_1 + 3));
    local_1310 = local_1310 + 1;
    pvVar20 = (void *)(ulong)local_1310;
  }
  local_1360 = 0;
  while ((int)local_1360 < 3) {
    local_1364 = init::queryTypes[(int)local_1360];
    pBVar22 = (BufferBindingTestCase *)operator_new(0x88);
    QVar3 = local_1364;
    queryType_2._2_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_queryTypeNdx_2,"element_array_buffer_binding",
               (allocator<char> *)((long)&queryType_2 + 3));
    pcVar8 = anon_unknown_2::getQueryTypeSuffix(local_1364);
    std::operator+(&local_1388,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_queryTypeNdx_2,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::BufferBindingTestCase::BufferBindingTestCase
              (pBVar22,pCVar1,QVar3,pcVar8,"ELEMENT_ARRAY_BUFFER_BINDING",0x8895,0x8893);
    queryType_2._2_1_ = QUERY_BOOLEAN >> 0x10;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pBVar22);
    std::__cxx11::string::~string((string *)&local_1388);
    std::__cxx11::string::~string((string *)&_queryTypeNdx_2);
    std::allocator<char>::~allocator((allocator<char> *)((long)&queryType_2 + 3));
    local_1360 = local_1360 + 1;
    pvVar20 = (void *)(ulong)local_1360;
  }
  local_13b0 = 0;
  while ((int)local_13b0 < 3) {
    local_13b4 = init::queryTypes[(int)local_13b0];
    pTVar13 = (TestNode *)operator_new(0x80);
    QVar3 = local_13b4;
    verifier_48._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_48,"current_program_binding",
               (allocator<char> *)((long)&verifier_48 + 7));
    pcVar8 = anon_unknown_2::getQueryTypeSuffix(local_13b4);
    std::operator+(&local_13d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_48,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::CurrentProgramBindingTestCase::CurrentProgramBindingTestCase
              ((CurrentProgramBindingTestCase *)pTVar13,pCVar1,QVar3,pcVar8,"CURRENT_PROGRAM");
    verifier_48._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,pTVar13);
    std::__cxx11::string::~string((string *)&local_13d8);
    std::__cxx11::string::~string((string *)&_verifierNdx_48);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_48 + 7));
    local_13b0 = local_13b0 + 1;
    pvVar20 = (void *)(ulong)local_13b0;
  }
  verifier_48._0_4_ = 0;
  while ((int)(uint)verifier_48 < 3) {
    local_1408 = *(StateVerifier **)(&_verifierNdx + (long)(int)(uint)verifier_48 * 2);
    this_17 = (StencilClearValueTestCase *)operator_new(0xa0);
    pSVar2 = local_1408;
    verifier_49._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_49,"stencil_clear_value",
               (allocator<char> *)((long)&verifier_49 + 7));
    pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_1408);
    std::operator+(&local_1428,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_49,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::StencilClearValueTestCase::StencilClearValueTestCase
              (this_17,pCVar1,pSVar2,pcVar8,"STENCIL_CLEAR_VALUE");
    verifier_49._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_17);
    std::__cxx11::string::~string((string *)&local_1428);
    std::__cxx11::string::~string((string *)&_verifierNdx_49);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_49 + 7));
    verifier_48._0_4_ = (uint)verifier_48 + 1;
    pvVar20 = (void *)(ulong)(uint)verifier_48;
  }
  verifier_49._0_4_ = 0;
  while ((int)(uint)verifier_49 < 3) {
    local_1458 = *(StateVerifier **)(&_verifierNdx + (long)(int)(uint)verifier_49 * 2);
    this_18 = (ActiveTextureTestCase *)operator_new(0xa0);
    pSVar2 = local_1458;
    queryType_3._2_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_queryTypeNdx_3,"active_texture",
               (allocator<char> *)((long)&queryType_3 + 3));
    pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_1458);
    std::operator+(&local_1478,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_queryTypeNdx_3,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::ActiveTextureTestCase::ActiveTextureTestCase
              (this_18,pCVar1,pSVar2,pcVar8,"ACTIVE_TEXTURE");
    queryType_3._2_1_ = QUERY_BOOLEAN >> 0x10;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_18);
    std::__cxx11::string::~string((string *)&local_1478);
    std::__cxx11::string::~string((string *)&_queryTypeNdx_3);
    std::allocator<char>::~allocator((allocator<char> *)((long)&queryType_3 + 3));
    verifier_49._0_4_ = (uint)verifier_49 + 1;
    pvVar20 = (void *)(ulong)(uint)verifier_49;
  }
  local_14a0 = 0;
  while ((int)local_14a0 < 3) {
    local_14a4 = init::queryTypes[(int)local_14a0];
    pTVar13 = (TestNode *)operator_new(0x80);
    QVar3 = local_14a4;
    queryType_4._2_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_queryTypeNdx_4,"renderbuffer_binding",
               (allocator<char> *)((long)&queryType_4 + 3));
    pcVar8 = anon_unknown_2::getQueryTypeSuffix(local_14a4);
    std::operator+(&local_14c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_queryTypeNdx_4,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::RenderbufferBindingTestCase::RenderbufferBindingTestCase
              ((RenderbufferBindingTestCase *)pTVar13,pCVar1,QVar3,pcVar8,"RENDERBUFFER_BINDING");
    queryType_4._2_1_ = QUERY_BOOLEAN >> 0x10;
    tcu::TestNode::addChild((TestNode *)this,pTVar13);
    std::__cxx11::string::~string((string *)&local_14c8);
    std::__cxx11::string::~string((string *)&_queryTypeNdx_4);
    std::allocator<char>::~allocator((allocator<char> *)((long)&queryType_4 + 3));
    local_14a0 = local_14a0 + 1;
    pvVar20 = (void *)(ulong)local_14a0;
  }
  local_14f0 = 0;
  while ((int)local_14f0 < 3) {
    local_14f4 = init::queryTypes[(int)local_14f0];
    pTVar23 = (TextureBindingTestCase *)operator_new(0x88);
    QVar3 = local_14f4;
    queryType_5._2_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_queryTypeNdx_5,"texture_binding_2d",
               (allocator<char> *)((long)&queryType_5 + 3));
    pcVar8 = anon_unknown_2::getQueryTypeSuffix(local_14f4);
    std::operator+(&local_1518,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_queryTypeNdx_5,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::TextureBindingTestCase::TextureBindingTestCase
              (pTVar23,pCVar1,QVar3,pcVar8,"TEXTURE_BINDING_2D",0x8069,0xde1);
    queryType_5._2_1_ = QUERY_BOOLEAN >> 0x10;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar23);
    std::__cxx11::string::~string((string *)&local_1518);
    std::__cxx11::string::~string((string *)&_queryTypeNdx_5);
    std::allocator<char>::~allocator((allocator<char> *)((long)&queryType_5 + 3));
    local_14f0 = local_14f0 + 1;
    pvVar20 = (void *)(ulong)local_14f0;
  }
  local_1540 = 0;
  while ((int)local_1540 < 3) {
    local_1544 = init::queryTypes[(int)local_1540];
    pTVar23 = (TextureBindingTestCase *)operator_new(0x88);
    QVar3 = local_1544;
    queryType_6._2_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_queryTypeNdx_6,"texture_binding_cube_map",
               (allocator<char> *)((long)&queryType_6 + 3));
    pcVar8 = anon_unknown_2::getQueryTypeSuffix(local_1544);
    std::operator+(&local_1568,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_queryTypeNdx_6,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::TextureBindingTestCase::TextureBindingTestCase
              (pTVar23,pCVar1,QVar3,pcVar8,"TEXTURE_BINDING_CUBE_MAP",0x8514,0x8513);
    queryType_6._2_1_ = QUERY_BOOLEAN >> 0x10;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar23);
    std::__cxx11::string::~string((string *)&local_1568);
    std::__cxx11::string::~string((string *)&_queryTypeNdx_6);
    std::allocator<char>::~allocator((allocator<char> *)((long)&queryType_6 + 3));
    local_1540 = local_1540 + 1;
    pvVar20 = (void *)(ulong)local_1540;
  }
  local_1590 = 0;
  while ((int)local_1590 < 3) {
    local_1594 = init::queryTypes[(int)local_1590];
    pTVar13 = (TestNode *)operator_new(0x80);
    QVar3 = local_1594;
    verifier_50._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_50,"framebuffer_binding",
               (allocator<char> *)((long)&verifier_50 + 7));
    pcVar8 = anon_unknown_2::getQueryTypeSuffix(local_1594);
    std::operator+(&local_15b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_50,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::FrameBufferBindingTestCase::FrameBufferBindingTestCase
              ((FrameBufferBindingTestCase *)pTVar13,pCVar1,QVar3,pcVar8,
               "DRAW_FRAMEBUFFER_BINDING and READ_FRAMEBUFFER_BINDING");
    verifier_50._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,pTVar13);
    std::__cxx11::string::~string((string *)&local_15b8);
    std::__cxx11::string::~string((string *)&_verifierNdx_50);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_50 + 7));
    local_1590 = local_1590 + 1;
    pvVar20 = (void *)(ulong)local_1590;
  }
  verifier_50._0_4_ = 0;
  while ((int)(uint)verifier_50 < 3) {
    local_15e8 = *(StateVerifier **)(&_verifierNdx + (long)(int)(uint)verifier_50 * 2);
    this_19 = (ImplementationColorReadTestCase *)operator_new(0xa0);
    pSVar2 = local_15e8;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1628,"implementation_color_read",&local_1629);
    pcVar8 = IntegerStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_15e8);
    std::operator+(&local_1608,&local_1628,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::ImplementationColorReadTestCase::ImplementationColorReadTestCase
              (this_19,pCVar1,pSVar2,pcVar8,
               "IMPLEMENTATION_COLOR_READ_TYPE and IMPLEMENTATION_COLOR_READ_FORMAT");
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_19);
    std::__cxx11::string::~string((string *)&local_1608);
    std::__cxx11::string::~string((string *)&local_1628);
    std::allocator<char>::~allocator(&local_1629);
    verifier_50._0_4_ = (uint)verifier_50 + 1;
    pvVar20 = (void *)(ulong)(uint)verifier_50;
  }
  return (int)pvVar20;
}

Assistant:

void IntegerStateQueryTests::init (void)
{
	static const QueryType queryTypes[] =
	{
		QUERY_BOOLEAN,
		QUERY_INTEGER,
		QUERY_FLOAT,
	};

	DE_ASSERT(m_verifierBoolean == DE_NULL);
	DE_ASSERT(m_verifierInteger == DE_NULL);
	DE_ASSERT(m_verifierFloat == DE_NULL);

	m_verifierBoolean		= new GetBooleanVerifier	(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());
	m_verifierInteger		= new GetIntegerVerifier	(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());
	m_verifierFloat			= new GetFloatVerifier		(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());

	const struct LimitedStateInteger
	{
		const char*		name;
		const char*		description;
		GLenum			targetName;
		GLint			value;
	} implementationMinLimits[] =
	{
		{ "subpixel_bits",						"SUBPIXEL_BITS has  a minimum value of 4",						GL_SUBPIXEL_BITS,						4	},
		{ "max_texture_size",					"MAX_TEXTURE_SIZE has  a minimum value of 64",					GL_MAX_TEXTURE_SIZE,					64	},
		{ "max_cube_map_texture_size",			"MAX_CUBE_MAP_TEXTURE_SIZE has  a minimum value of 16",			GL_MAX_CUBE_MAP_TEXTURE_SIZE,			16	},
		{ "max_vertex_attribs",					"MAX_VERTEX_ATTRIBS has  a minimum value of 8",					GL_MAX_VERTEX_ATTRIBS,					8	},
		{ "max_vertex_uniform_vectors",			"MAX_VERTEX_UNIFORM_VECTORS has  a minimum value of 128",		GL_MAX_VERTEX_UNIFORM_VECTORS,			128	},
		{ "max_varying_vectors",				"MAX_VARYING_VECTORS has  a minimum value of 8",				GL_MAX_VARYING_VECTORS,					8	},
		{ "max_combined_texture_image_units",	"MAX_COMBINED_TEXTURE_IMAGE_UNITS has  a minimum value of 8",	GL_MAX_COMBINED_TEXTURE_IMAGE_UNITS,	8	},
		{ "max_vertex_texture_image_units",		"MAX_VERTEX_TEXTURE_IMAGE_UNITS has  a minimum value of 0",		GL_MAX_VERTEX_TEXTURE_IMAGE_UNITS,		0	},
		{ "max_texture_image_units",			"MAX_TEXTURE_IMAGE_UNITS has  a minimum value of 8",			GL_MAX_TEXTURE_IMAGE_UNITS,				8	},
		{ "max_fragment_uniform_vectors",		"MAX_FRAGMENT_UNIFORM_VECTORS has  a minimum value of 16",		GL_MAX_FRAGMENT_UNIFORM_VECTORS,		16	},
		{ "max_renderbuffer_size",				"MAX_RENDERBUFFER_SIZE has  a minimum value of 1",				GL_MAX_RENDERBUFFER_SIZE,				1	},
	};

	// \note implementation defined limits have their own tests so just check the conversions to boolean and float
	StateVerifier* implementationLimitVerifiers[]	= {m_verifierBoolean,						m_verifierFloat};
	StateVerifier* normalVerifiers[]				= {m_verifierBoolean,	m_verifierInteger,	m_verifierFloat};

	for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(implementationMinLimits); testNdx++)
		FOR_EACH_VERIFIER(implementationLimitVerifiers, addChild(new ConstantMinimumValueTestCase(m_context, verifier, (std::string(implementationMinLimits[testNdx].name) + verifier->getTestNamePostfix()).c_str(), implementationMinLimits[testNdx].description, implementationMinLimits[testNdx].targetName, implementationMinLimits[testNdx].value)));

	FOR_EACH_VERIFIER(implementationLimitVerifiers, addChild(new SampleBuffersTestCase		(m_context,	 verifier, (std::string("sample_buffers")						+ verifier->getTestNamePostfix()).c_str(),		"SAMPLE_BUFFERS")));

	FOR_EACH_VERIFIER(normalVerifiers, addChild(new SamplesTestCase				(m_context,	 verifier, (std::string("samples")								+ verifier->getTestNamePostfix()).c_str(),		"SAMPLES")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new HintTestCase				(m_context,	 verifier, (std::string("generate_mipmap_hint")					+ verifier->getTestNamePostfix()).c_str(),		"GENERATE_MIPMAP_HINT",				GL_GENERATE_MIPMAP_HINT)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new DepthFuncTestCase			(m_context,	 verifier, (std::string("depth_func")							+ verifier->getTestNamePostfix()).c_str(),		"DEPTH_FUNC")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new CullFaceTestCase			(m_context,	 verifier, (std::string("cull_face_mode")						+ verifier->getTestNamePostfix()).c_str(),		"CULL_FACE_MODE")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new FrontFaceTestCase			(m_context,	 verifier, (std::string("front_face_mode")						+ verifier->getTestNamePostfix()).c_str(),		"FRONT_FACE")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new ViewPortTestCase			(m_context,	 verifier, (std::string("viewport")								+ verifier->getTestNamePostfix()).c_str(),		"VIEWPORT")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new ScissorBoxTestCase			(m_context,	 verifier, (std::string("scissor_box")							+ verifier->getTestNamePostfix()).c_str(),		"SCISSOR_BOX")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new MaxViewportDimsTestCase		(m_context,	 verifier, (std::string("max_viewport_dims")					+ verifier->getTestNamePostfix()).c_str(),		"MAX_VIEWPORT_DIMS")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new BufferComponentSizeCase		(m_context,	 verifier, (std::string("buffer_component_size")				+ verifier->getTestNamePostfix()).c_str(),		"x BITS")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilRefTestCase			(m_context,	 verifier, (std::string("stencil_ref")							+ verifier->getTestNamePostfix()).c_str(),		"STENCIL_REF",						GL_STENCIL_REF)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilRefTestCase			(m_context,	 verifier, (std::string("stencil_back_ref")						+ verifier->getTestNamePostfix()).c_str(),		"STENCIL_BACK_REF",					GL_STENCIL_BACK_REF)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilRefSeparateTestCase	(m_context,	 verifier, (std::string("stencil_ref_separate")					+ verifier->getTestNamePostfix()).c_str(),		"STENCIL_REF (separate)",			GL_STENCIL_REF,			GL_FRONT)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilRefSeparateTestCase	(m_context,	 verifier, (std::string("stencil_ref_separate_both")			+ verifier->getTestNamePostfix()).c_str(),		"STENCIL_REF (separate)",			GL_STENCIL_REF,			GL_FRONT_AND_BACK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilRefSeparateTestCase	(m_context,	 verifier, (std::string("stencil_back_ref_separate")			+ verifier->getTestNamePostfix()).c_str(),		"STENCIL_BACK_REF (separate)",		GL_STENCIL_BACK_REF,	GL_BACK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilRefSeparateTestCase	(m_context,	 verifier, (std::string("stencil_back_ref_separate_both")		+ verifier->getTestNamePostfix()).c_str(),		"STENCIL_BACK_REF (separate)",		GL_STENCIL_BACK_REF,	GL_FRONT_AND_BACK)));

	const struct NamedStencilOp
	{
		const char*		name;

		const char*		frontDescription;
		GLenum			frontTarget;
		const char*		backDescription;
		GLenum			backTarget;
	} stencilOps[] =
	{
		{ "fail",		"STENCIL_FAIL",				GL_STENCIL_FAIL,			"STENCIL_BACK_FAIL",			GL_STENCIL_BACK_FAIL			},
		{ "depth_fail",	"STENCIL_PASS_DEPTH_FAIL",	GL_STENCIL_PASS_DEPTH_FAIL,	"STENCIL_BACK_PASS_DEPTH_FAIL",	GL_STENCIL_BACK_PASS_DEPTH_FAIL	},
		{ "depth_pass",	"STENCIL_PASS_DEPTH_PASS",	GL_STENCIL_PASS_DEPTH_PASS,	"STENCIL_BACK_PASS_DEPTH_PASS",	GL_STENCIL_BACK_PASS_DEPTH_PASS	}
	};

	for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(stencilOps); testNdx++)
	{
		FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilOpTestCase			(m_context, verifier, (std::string("stencil_")		+ stencilOps[testNdx].name + verifier->getTestNamePostfix()).c_str(), stencilOps[testNdx].frontDescription,	stencilOps[testNdx].frontTarget)));
		FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilOpTestCase			(m_context, verifier, (std::string("stencil_back_")	+ stencilOps[testNdx].name + verifier->getTestNamePostfix()).c_str(), stencilOps[testNdx].backDescription,	stencilOps[testNdx].backTarget)));

		FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilOpSeparateTestCase	(m_context, verifier, (std::string("stencil_")		+ stencilOps[testNdx].name + "_separate_both"	+ verifier->getTestNamePostfix()).c_str(), stencilOps[testNdx].frontDescription,	stencilOps[testNdx].frontTarget,	GL_FRONT_AND_BACK)));
		FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilOpSeparateTestCase	(m_context, verifier, (std::string("stencil_back_")	+ stencilOps[testNdx].name + "_separate_both"	+ verifier->getTestNamePostfix()).c_str(), stencilOps[testNdx].backDescription,		stencilOps[testNdx].backTarget,		GL_FRONT_AND_BACK)));

		FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilOpSeparateTestCase	(m_context, verifier, (std::string("stencil_")		+ stencilOps[testNdx].name + "_separate"		+ verifier->getTestNamePostfix()).c_str(), stencilOps[testNdx].frontDescription,	stencilOps[testNdx].frontTarget,	GL_FRONT)));
		FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilOpSeparateTestCase	(m_context, verifier, (std::string("stencil_back_")	+ stencilOps[testNdx].name + "_separate"		+ verifier->getTestNamePostfix()).c_str(), stencilOps[testNdx].backDescription,		stencilOps[testNdx].backTarget,		GL_BACK)));
	}

	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilFuncTestCase					(m_context, verifier,	(std::string("stencil_func")								+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_FUNC")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilFuncSeparateTestCase			(m_context, verifier,	(std::string("stencil_func_separate")						+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_FUNC (separate)",				GL_STENCIL_FUNC,				GL_FRONT)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilFuncSeparateTestCase			(m_context, verifier,	(std::string("stencil_func_separate_both")					+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_FUNC (separate)",				GL_STENCIL_FUNC,				GL_FRONT_AND_BACK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilFuncSeparateTestCase			(m_context, verifier,	(std::string("stencil_back_func_separate")					+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_FUNC (separate)",				GL_STENCIL_BACK_FUNC,			GL_BACK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilFuncSeparateTestCase			(m_context, verifier,	(std::string("stencil_back_func_separate_both")				+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_FUNC (separate)",				GL_STENCIL_BACK_FUNC,			GL_FRONT_AND_BACK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilMaskTestCase					(m_context, verifier,	(std::string("stencil_value_mask")							+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_VALUE_MASK",					GL_STENCIL_VALUE_MASK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilMaskTestCase					(m_context, verifier,	(std::string("stencil_back_value_mask")						+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_BACK_VALUE_MASK",				GL_STENCIL_BACK_VALUE_MASK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilMaskSeparateTestCase			(m_context, verifier,	(std::string("stencil_value_mask_separate")					+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_VALUE_MASK (separate)",		GL_STENCIL_VALUE_MASK,			GL_FRONT)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilMaskSeparateTestCase			(m_context, verifier,	(std::string("stencil_value_mask_separate_both")			+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_VALUE_MASK (separate)",		GL_STENCIL_VALUE_MASK,			GL_FRONT_AND_BACK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilMaskSeparateTestCase			(m_context, verifier,	(std::string("stencil_back_value_mask_separate")			+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_BACK_VALUE_MASK (separate)",	GL_STENCIL_BACK_VALUE_MASK,		GL_BACK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilMaskSeparateTestCase			(m_context, verifier,	(std::string("stencil_back_value_mask_separate_both")		+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_BACK_VALUE_MASK (separate)",	GL_STENCIL_BACK_VALUE_MASK,		GL_FRONT_AND_BACK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilWriteMaskTestCase			(m_context, verifier,	(std::string("stencil_writemask")							+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_WRITEMASK",					GL_STENCIL_WRITEMASK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilWriteMaskTestCase			(m_context, verifier,	(std::string("stencil_back_writemask")						+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_BACK_WRITEMASK",				GL_STENCIL_BACK_WRITEMASK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilWriteMaskSeparateTestCase	(m_context, verifier,	(std::string("stencil_writemask_separate")					+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_WRITEMASK (separate)",			GL_STENCIL_WRITEMASK,			GL_FRONT)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilWriteMaskSeparateTestCase	(m_context, verifier,	(std::string("stencil_writemask_separate_both")				+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_WRITEMASK (separate)",			GL_STENCIL_WRITEMASK,			GL_FRONT_AND_BACK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilWriteMaskSeparateTestCase	(m_context, verifier,	(std::string("stencil_back_writemask_separate")				+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_BACK_WRITEMASK (separate)",	GL_STENCIL_BACK_WRITEMASK,		GL_BACK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilWriteMaskSeparateTestCase	(m_context, verifier,	(std::string("stencil_back_writemask_separate_both")		+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_BACK_WRITEMASK (separate)",	GL_STENCIL_BACK_WRITEMASK,		GL_FRONT_AND_BACK)));

	FOR_EACH_VERIFIER(normalVerifiers, addChild(new PixelStoreAlignTestCase(m_context, verifier, (std::string("unpack_alignment")	+ verifier->getTestNamePostfix()).c_str(),	"UNPACK_ALIGNMENT",	GL_UNPACK_ALIGNMENT)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new PixelStoreAlignTestCase(m_context, verifier, (std::string("pack_alignment")		+ verifier->getTestNamePostfix()).c_str(),	"PACK_ALIGNMENT",	GL_PACK_ALIGNMENT)));

	{
		const struct BlendColorState
		{
			const char*	name;
			const char*	description;
			GLenum		target;
			int			initialValue;
		} blendColorStates[] =
		{
			{ "blend_src_rgb",		"BLEND_SRC_RGB",	GL_BLEND_SRC_RGB,		GL_ONE	},
			{ "blend_src_alpha",	"BLEND_SRC_ALPHA",	GL_BLEND_SRC_ALPHA,		GL_ONE	},
			{ "blend_dst_rgb",		"BLEND_DST_RGB",	GL_BLEND_DST_RGB,		GL_ZERO	},
			{ "blend_dst_alpha",	"BLEND_DST_ALPHA",	GL_BLEND_DST_ALPHA,		GL_ZERO	}
		};
		for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(blendColorStates); testNdx++)
		{
			FOR_EACH_VERIFIER(normalVerifiers, addChild(new BlendFuncTestCase			(m_context, verifier, (std::string(blendColorStates[testNdx].name)					+ verifier->getTestNamePostfix()).c_str(),	blendColorStates[testNdx].description,	blendColorStates[testNdx].target,	blendColorStates[testNdx].initialValue)));
			FOR_EACH_VERIFIER(normalVerifiers, addChild(new BlendFuncSeparateTestCase	(m_context, verifier, (std::string(blendColorStates[testNdx].name) + "_separate"	+ verifier->getTestNamePostfix()).c_str(),	blendColorStates[testNdx].description,	blendColorStates[testNdx].target,	blendColorStates[testNdx].initialValue)));
		}
	}

	{
		const struct BlendEquationState
		{
			const char*	name;
			const char*	description;
			GLenum		target;
			int			initialValue;
		} blendEquationStates[] =
		{
			{ "blend_equation_rgb",		"BLEND_EQUATION_RGB",	GL_BLEND_EQUATION_RGB,		GL_FUNC_ADD	},
			{ "blend_equation_alpha",	"BLEND_EQUATION_ALPHA",	GL_BLEND_EQUATION_ALPHA,	GL_FUNC_ADD	}
		};
		for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(blendEquationStates); testNdx++)
		{
			FOR_EACH_VERIFIER(normalVerifiers, addChild(new BlendEquationTestCase			(m_context, verifier, (std::string(blendEquationStates[testNdx].name) +				+ verifier->getTestNamePostfix()).c_str(),		blendEquationStates[testNdx].description,	blendEquationStates[testNdx].target,	blendEquationStates[testNdx].initialValue)));
			FOR_EACH_VERIFIER(normalVerifiers, addChild(new BlendEquationSeparateTestCase	(m_context, verifier, (std::string(blendEquationStates[testNdx].name) + "_separate"	+ verifier->getTestNamePostfix()).c_str(),		blendEquationStates[testNdx].description,	blendEquationStates[testNdx].target,	blendEquationStates[testNdx].initialValue)));
		}
	}

	FOR_EACH_VERIFIER(normalVerifiers, addChild(new ImplementationArrayTestCase			(m_context, verifier, (std::string("compressed_texture_formats")	+ verifier->getTestNamePostfix()).c_str(),	"COMPRESSED_TEXTURE_FORMATS",	GL_COMPRESSED_TEXTURE_FORMATS,		GL_NUM_COMPRESSED_TEXTURE_FORMATS,	0)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new ImplementationArrayTestCase			(m_context, verifier, (std::string("shader_binary_formats")			+ verifier->getTestNamePostfix()).c_str(),	"SHADER_BINARY_FORMATS",		GL_SHADER_BINARY_FORMATS,			GL_NUM_SHADER_BINARY_FORMATS,		0)));

	FOR_EACH_QUERYTYPE(queryTypes,     addChild(new BufferBindingTestCase				(m_context, queryType, (std::string("array_buffer_binding")			+ getQueryTypeSuffix(queryType)).c_str(),	"ARRAY_BUFFER_BINDING",			GL_ARRAY_BUFFER_BINDING,			GL_ARRAY_BUFFER)));
	FOR_EACH_QUERYTYPE(queryTypes,     addChild(new BufferBindingTestCase				(m_context, queryType, (std::string("element_array_buffer_binding")	+ getQueryTypeSuffix(queryType)).c_str(),	"ELEMENT_ARRAY_BUFFER_BINDING",	GL_ELEMENT_ARRAY_BUFFER_BINDING,	GL_ELEMENT_ARRAY_BUFFER)));

	FOR_EACH_QUERYTYPE(queryTypes,     addChild(new CurrentProgramBindingTestCase		(m_context, queryType, (std::string("current_program_binding")		+ getQueryTypeSuffix(queryType)).c_str(),	"CURRENT_PROGRAM")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilClearValueTestCase			(m_context, verifier, (std::string("stencil_clear_value")			+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_CLEAR_VALUE")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new ActiveTextureTestCase				(m_context, verifier, (std::string("active_texture")				+ verifier->getTestNamePostfix()).c_str(),	"ACTIVE_TEXTURE")));
	FOR_EACH_QUERYTYPE(queryTypes,     addChild(new RenderbufferBindingTestCase			(m_context, queryType, (std::string("renderbuffer_binding")			+ getQueryTypeSuffix(queryType)).c_str(),	"RENDERBUFFER_BINDING")));

	FOR_EACH_QUERYTYPE(queryTypes,     addChild(new TextureBindingTestCase				(m_context, queryType, (std::string("texture_binding_2d")			+ getQueryTypeSuffix(queryType)).c_str(),	"TEXTURE_BINDING_2D",			GL_TEXTURE_BINDING_2D,			GL_TEXTURE_2D)));
	FOR_EACH_QUERYTYPE(queryTypes,     addChild(new TextureBindingTestCase				(m_context, queryType, (std::string("texture_binding_cube_map")		+ getQueryTypeSuffix(queryType)).c_str(),	"TEXTURE_BINDING_CUBE_MAP",		GL_TEXTURE_BINDING_CUBE_MAP,	GL_TEXTURE_CUBE_MAP)));

	FOR_EACH_QUERYTYPE(queryTypes,     addChild(new FrameBufferBindingTestCase			(m_context, queryType, (std::string("framebuffer_binding")			+ getQueryTypeSuffix(queryType)).c_str(),	"DRAW_FRAMEBUFFER_BINDING and READ_FRAMEBUFFER_BINDING")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new ImplementationColorReadTestCase		(m_context, verifier, (std::string("implementation_color_read")		+ verifier->getTestNamePostfix()).c_str(),	"IMPLEMENTATION_COLOR_READ_TYPE and IMPLEMENTATION_COLOR_READ_FORMAT")));
}